

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::clara::detail::Help::Help(Help *this,bool *showHelpFlag)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  value_type local_90;
  value_type local_70;
  value_type local_50;
  
  local_b0._M_dataplus._M_p = showHelpFlag;
  Opt::Opt<Catch::clara::detail::Help::Help(bool&)::_lambda(bool)_1_>
            (&this->super_Opt,(anon_class_8_1_beab0a68_for_m_lambda *)&local_b0);
  (this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.
  super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__Opt_00192db8;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"display usage information","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&(this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.m_description,
             &local_b0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-?","");
  this_00 = &(this->super_Opt).m_optNames;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"-h","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_70);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"--help","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_90);
  (this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.m_optionality = Optional;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Help( bool &showHelpFlag )
        :   Opt([&]( bool flag ) {
                showHelpFlag = flag;
                return ParserResult::ok( ParseResultType::ShortCircuitAll );
            })
        {
            static_cast<Opt &>( *this )
                    ("display usage information")
                    ["-?"]["-h"]["--help"]
                    .optional();
        }